

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
::AssertHashEqConsistent<google::protobuf::OneofDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
           *this,OneofDescriptor **key)

{
  OneofDescriptor *pOVar1;
  OneofDescriptor *pOVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 *puVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  uint64_t v_2;
  uint64_t v_4;
  
  if (1 < *(ulong *)(this + 8)) {
    pOVar1 = *key;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (OneofDescriptor *)((long)&hash_internal::MixingHashState::kSeed + (long)pOVar1);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pOVar1 + (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0) ^
                            SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar16 = *(ulong *)this;
    if (uVar16 < 0x11) {
      uVar13 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
      pauVar17 = *(undefined1 (**) [16])(this + 0x10);
      lVar15 = *(long *)(this + 0x18);
      if (uVar16 < 0xf) {
        if (8 < uVar16) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        uVar16 = *(ulong *)(*pauVar17 + uVar16) & 0x8080808080808080;
        if (uVar16 != 0x8080808080808080) {
          uVar16 = uVar16 ^ 0x8080808080808080;
          do {
            uVar4 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            pOVar2 = *(OneofDescriptor **)(lVar15 + -0x48 + (uVar4 >> 3 & 0x1fffffff) * 0x48);
            if ((pOVar2 == pOVar1) &&
               (auVar7._8_8_ = 0,
               auVar7._0_8_ = (OneofDescriptor *)
                              ((long)&hash_internal::MixingHashState::kSeed + (long)pOVar2),
               auVar8._8_8_ = 0,
               auVar8._0_8_ = pOVar2 + (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0) ^
                                       SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8)),
               uVar13 != (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
                         SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_0024b0b2:
              __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf1b,
                            "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>>::AssertHashEqConsistent(const google::protobuf::OneofDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Hash = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>]"
                           );
            }
            uVar16 = uVar16 & uVar16 - 1;
          } while (uVar16 != 0);
        }
      }
      else {
        uVar16 = *(ulong *)(this + 8) >> 1;
        while( true ) {
          auVar5 = *pauVar17;
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar5[0xf] >> 7) << 0xf);
          if (uVar14 != 0xffff) {
            uVar14 = ~uVar14;
            do {
              uVar3 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              if ((char)(*pauVar17)[uVar3] < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              pOVar2 = *(OneofDescriptor **)(lVar15 + (ulong)uVar3 * 0x48);
              if ((pOVar2 == pOVar1) &&
                 (auVar9._8_8_ = 0,
                 auVar9._0_8_ = (OneofDescriptor *)
                                ((long)&hash_internal::MixingHashState::kSeed + (long)pOVar2),
                 auVar10._8_8_ = 0,
                 auVar10._0_8_ =
                      pOVar2 + (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
                               SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)),
                 uVar13 != (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
                           SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_0024b0b2;
              uVar16 = uVar16 - 1;
              uVar12 = (ushort)(uVar14 - 1) & (ushort)uVar14;
              uVar14 = CONCAT22((short)(uVar14 - 1 >> 0x10),uVar12);
            } while (uVar12 != 0);
          }
          if (uVar16 == 0) break;
          lVar15 = lVar15 + 0x480;
          puVar11 = *pauVar17;
          pauVar17 = pauVar17 + 1;
          if (puVar11[0xf] == -1) {
            __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x76b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  return;
}

Assistant:

size_t size() const { return size_ >> HasInfozShift(); }